

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

_Bool intersect_segment_triangle(vec3 p,vec3 q,vec3 a,vec3 b,vec3 c,float *t)

{
  float fVar1;
  float fVar2;
  float fVar3;
  vec3 v1;
  vec3 v2;
  vec3 vVar4;
  vec3 v2_00;
  vec3 v1_00;
  float ood;
  float w;
  float v;
  vec3 e;
  vec3 ap;
  float d;
  vec3 n;
  vec3 qp;
  vec3 ac;
  vec3 ab;
  float *t_local;
  vec3 b_local;
  vec3 a_local;
  vec3 q_local;
  vec3 p_local;
  
  v1 = vec3_subtract(b,a);
  v2 = vec3_subtract(c,a);
  vVar4 = vec3_subtract(p,q);
  v2_00 = vec3_cross(v1,v2);
  fVar1 = vec3_dot(vVar4,v2_00);
  if (0.0 < fVar1) {
    v1_00 = vec3_subtract(p,a);
    fVar2 = vec3_dot(v1_00,v2_00);
    *t = fVar2;
    if (0.0 < *t || *t == 0.0) {
      vVar4 = vec3_cross(vVar4,v1_00);
      fVar2 = vec3_dot(v2,vVar4);
      if ((fVar2 < 0.0) || (fVar1 < fVar2)) {
        p_local.y._3_1_ = false;
      }
      else {
        fVar3 = vec3_dot(v1,vVar4);
        if ((-fVar3 < 0.0) || (fVar1 < fVar2 + -fVar3)) {
          p_local.y._3_1_ = false;
        }
        else {
          *t = (1.0 / fVar1) * *t;
          p_local.y._3_1_ = true;
        }
      }
    }
    else {
      p_local.y._3_1_ = false;
    }
  }
  else {
    p_local.y._3_1_ = false;
  }
  return p_local.y._3_1_;
}

Assistant:

static bool intersect_segment_triangle(vec3 p, vec3 q, vec3 a, vec3 b, vec3 c, float *t) {
    vec3 ab = vec3_subtract(b, a);
    vec3 ac = vec3_subtract(c, a);
    vec3 qp = vec3_subtract(p, q);

    vec3 n = vec3_cross(ab, ac);

    float d = vec3_dot(qp, n);
    if (d <= 0.0f) return false;

    vec3 ap = vec3_subtract(p, a);
    *t = vec3_dot(ap, n);
    if (*t < 0.0f) return false;
    //if (*t > d) return false;

    vec3 e = vec3_cross(qp, ap);
    float v = vec3_dot(ac, e);
    if (v < 0.0f || v > d) return false;
    float w = -vec3_dot(ab, e);
    if (w < 0.0f || v + w > d) return false;

    float ood = 1.0f / d;
    *t *= ood;
    return true;
}